

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O1

void indexedY_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  byte bVar1;
  long lVar2;
  cs_m680x_op *op;
  ushort uVar3;
  
  uVar3 = *address;
  *address = uVar3 + 1;
  lVar2 = (ulong)uVar3 - (ulong)info->offset;
  if ((uint)lVar2 < info->size) {
    uVar3 = (ushort)info->code[lVar2];
  }
  else {
    uVar3 = 0;
  }
  bVar1 = (info->m680x).op_count;
  (info->m680x).op_count = bVar1 + 1;
  op = (info->m680x).operands + bVar1;
  op->type = M680X_OP_INDEXED;
  set_operand_size(info,op,(uint8_t)address);
  *(undefined8 *)&(info->m680x).operands[bVar1].field_1 = 0xe;
  *(ushort *)((long)&(info->m680x).operands[bVar1].field_1 + 8) = uVar3;
  *(undefined4 *)((long)&(info->m680x).operands[bVar1].field_1 + 10) = 0x80000;
  return;
}

Assistant:

static void indexedY_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	uint8_t offset = 0;

	read_byte(info, &offset, (*address)++);

	add_indexed_operand(info, M680X_REG_Y, false, 0, M680X_OFFSET_BITS_8,
		(uint16_t)offset, false);
}